

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io-util.cc
# Opt level: O2

string * tinyusdz::io::FindFile
                   (string *__return_storage_ptr__,string *filename,
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *search_paths)

{
  pointer pbVar1;
  bool bVar2;
  void *extraout_RDX;
  size_t i;
  ulong uVar3;
  string *psVar4;
  long lVar5;
  string local_50;
  
  if (filename->_M_string_length == 0) {
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)filename);
  }
  else {
    if ((search_paths->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_start ==
        (search_paths->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_finish) {
      psVar4 = filename;
      ExpandFilePath(__return_storage_ptr__,filename,search_paths);
      bVar2 = FileExists(__return_storage_ptr__,psVar4);
      if (bVar2) {
        return __return_storage_ptr__;
      }
      ::std::__cxx11::string::_M_dispose();
    }
    lVar5 = 0;
    for (uVar3 = 0;
        pbVar1 = (search_paths->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start,
        uVar3 < (ulong)((long)(search_paths->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5);
        uVar3 = uVar3 + 1) {
      JoinPath(&local_50,(string *)((long)&(pbVar1->_M_dataplus)._M_p + lVar5),filename);
      psVar4 = &local_50;
      ExpandFilePath(__return_storage_ptr__,&local_50,extraout_RDX);
      ::std::__cxx11::string::_M_dispose();
      bVar2 = FileExists(__return_storage_ptr__,psVar4);
      if (bVar2) {
        return __return_storage_ptr__;
      }
      ::std::__cxx11::string::_M_dispose();
      lVar5 = lVar5 + 0x20;
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  return __return_storage_ptr__;
}

Assistant:

std::string FindFile(const std::string &filename,
                     const std::vector<std::string> &search_paths) {
  // TODO: Use ghc filesystem?

  if (filename.empty()) {
    return filename;
  }

  if (search_paths.empty()) {
    std::string absPath = io::ExpandFilePath(filename, /* userdata */ nullptr);
    if (io::FileExists(absPath, /* userdata */ nullptr)) {
      return absPath;
    }
  }

  for (size_t i = 0; i < search_paths.size(); i++) {
    std::string absPath = io::ExpandFilePath(
        io::JoinPath(search_paths[i], filename), /* userdata */ nullptr);
    if (io::FileExists(absPath, /* userdata */ nullptr)) {
      return absPath;
    }
  }

  return std::string();
}